

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitBlock(ParseNodeBlock *pnodeBlock,ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo,
              BOOL fReturnValue)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ParseNodeBin *pPVar4;
  FuncInfo *funcInfo_00;
  ParseNodePtr stmt;
  ParseNode *pPVar5;
  
  if ((pnodeBlock->super_ParseNodeStmt).super_ParseNode.nop != knopBlock) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x39c,"(pnodeBlock->nop == knopBlock)","pnodeBlock->nop == knopBlock");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  stmt = pnodeBlock->pnodeStmt;
  if (stmt != (ParseNodePtr)0x0) {
    BeginEmitBlock(pnodeBlock,byteCodeGenerator,funcInfo);
    pPVar5 = pnodeBlock->pnodeLastValStmt;
    while (stmt->nop == knopList) {
      pPVar4 = ParseNode::AsParseNodeBin(stmt);
      if (pPVar4->pnode1 == pPVar5) {
        pPVar5 = (ParseNode *)0x0;
      }
      ByteCodeGenerator::EmitTopLevelStatement
                (byteCodeGenerator,pPVar4->pnode1,funcInfo,
                 (uint)(pPVar5 == (ParseNode *)0x0 && fReturnValue != 0));
      pPVar4 = ParseNode::AsParseNodeBin(stmt);
      stmt = pPVar4->pnode2;
    }
    ByteCodeGenerator::EmitTopLevelStatement
              (byteCodeGenerator,stmt,funcInfo,
               (uint)((pPVar5 == (ParseNode *)0x0 || stmt == pPVar5) && fReturnValue != 0));
    EndEmitBlock(pnodeBlock,byteCodeGenerator,funcInfo_00);
    return;
  }
  return;
}

Assistant:

void EmitBlock(ParseNodeBlock *pnodeBlock, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo, BOOL fReturnValue)
{
    Assert(pnodeBlock->nop == knopBlock);
    ParseNode *pnode = pnodeBlock->pnodeStmt;
    if (pnode == nullptr)
    {
        return;
    }

    BeginEmitBlock(pnodeBlock, byteCodeGenerator, funcInfo);

    ParseNode *pnodeLastValStmt = pnodeBlock->pnodeLastValStmt;

    while (pnode->nop == knopList)
    {
        ParseNode* stmt = pnode->AsParseNodeBin()->pnode1;
        if (stmt == pnodeLastValStmt)
        {
            // This is the last guaranteed return value, so any potential return values have to be
            // copied to the return register from this point forward.
            pnodeLastValStmt = nullptr;
        }
        byteCodeGenerator->EmitTopLevelStatement(stmt, funcInfo, fReturnValue && (pnodeLastValStmt == nullptr));
        pnode = pnode->AsParseNodeBin()->pnode2;
    }

    if (pnode == pnodeLastValStmt)
    {
        pnodeLastValStmt = nullptr;
    }
    byteCodeGenerator->EmitTopLevelStatement(pnode, funcInfo, fReturnValue && (pnodeLastValStmt == nullptr));

    EndEmitBlock(pnodeBlock, byteCodeGenerator, funcInfo);
}